

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O3

int x509_profile_check_key(mbedtls_x509_crt_profile *profile,mbedtls_pk_context *pk)

{
  mbedtls_pk_type_t mVar1;
  int iVar2;
  size_t sVar3;
  
  mVar1 = mbedtls_pk_get_type(pk);
  if ((mVar1 == MBEDTLS_PK_RSASSA_PSS) || (mVar1 == MBEDTLS_PK_RSA)) {
    sVar3 = mbedtls_pk_get_bitlen(pk);
    iVar2 = -(uint)(sVar3 < profile->rsa_min_bitlen);
  }
  else {
    iVar2 = -1;
    if (mVar1 - MBEDTLS_PK_ECKEY < 3) {
      iVar2 = ((profile->allowed_curves >> ((byte)(*pk->pk_ctx - 1) & 0x1f) & 1) != 0) - 1;
    }
  }
  return iVar2;
}

Assistant:

static int x509_profile_check_key( const mbedtls_x509_crt_profile *profile,
                                   const mbedtls_pk_context *pk )
{
    const mbedtls_pk_type_t pk_alg = mbedtls_pk_get_type( pk );

#if defined(MBEDTLS_RSA_C)
    if( pk_alg == MBEDTLS_PK_RSA || pk_alg == MBEDTLS_PK_RSASSA_PSS )
    {
        if( mbedtls_pk_get_bitlen( pk ) >= profile->rsa_min_bitlen )
            return( 0 );

        return( -1 );
    }
#endif

#if defined(MBEDTLS_ECP_C)
    if( pk_alg == MBEDTLS_PK_ECDSA ||
        pk_alg == MBEDTLS_PK_ECKEY ||
        pk_alg == MBEDTLS_PK_ECKEY_DH )
    {
        const mbedtls_ecp_group_id gid = mbedtls_pk_ec( *pk )->grp.id;

        if( ( profile->allowed_curves & MBEDTLS_X509_ID_FLAG( gid ) ) != 0 )
            return( 0 );

        return( -1 );
    }
#endif

    return( -1 );
}